

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

MessageSizeCounts __thiscall capnp::_::ListReader::totalSize(ListReader *this)

{
  uint end;
  bool bVar1;
  BitsPerElementTableType BVar2;
  WordCount64 other;
  uint *puVar3;
  unsigned_long uVar4;
  unsigned_short *puVar5;
  MessageSizeCounts MVar6;
  MessageSizeCounts local_b0;
  unsigned_short local_9a;
  Iterator local_98;
  Iterator local_96;
  Range<unsigned_short> RStack_94;
  unsigned_short j;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_short> *__range5;
  Iterator local_80;
  uint i_1;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_int> *__range4;
  word *pos;
  unsigned_long wordSize;
  uint local_50;
  uint local_44;
  Iterator local_40;
  uint i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_int> *__range3;
  uint count;
  ListReader *this_local;
  MessageSizeCounts result;
  
  this_local = (ListReader *)0x0;
  result.wordCount._0_4_ = 0;
  result.wordCount._4_4_ = 0;
  switch(this->elementSize) {
  case VOID:
    break;
  case BIT:
  case BYTE:
  case TWO_BYTES:
  case FOUR_BYTES:
  case EIGHT_BYTES:
    uVar4 = upgradeBound<unsigned_long,unsigned_int>(this->elementCount);
    BVar2 = dataBitsPerElement(this->elementSize);
    other = WireHelpers::roundBitsUpToWords(uVar4 * BVar2);
    MessageSizeCounts::addWords((MessageSizeCounts *)&this_local,other);
    break;
  case POINTER:
    end = this->elementCount;
    MessageSizeCounts::addWords((MessageSizeCounts *)&this_local,(ulong)end);
    ___end3 = kj::zeroTo<unsigned_int>(end);
    i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3);
    local_40 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end3);
    while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_40), bVar1) {
      puVar3 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
      local_44 = *puVar3;
      MVar6 = WireHelpers::totalSize
                        (this->segment,(WirePointer *)(this->ptr + (ulong)local_44 * 8),
                         this->nestingLimit);
      wordSize = MVar6.wordCount;
      local_50 = MVar6.capCount;
      MessageSizeCounts::operator+=((MessageSizeCounts *)&this_local,(MessageSizeCounts *)&wordSize)
      ;
      kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
    }
    break;
  case INLINE_COMPOSITE:
    uVar4 = upgradeBound<unsigned_long,unsigned_int>(this->elementCount);
    MessageSizeCounts::addWords((MessageSizeCounts *)&this_local,(uVar4 * this->step >> 6) + 1);
    if (this->structPointerCount != 0) {
      __range4 = (Range<unsigned_int> *)this->ptr;
      ___end4 = kj::zeroTo<unsigned_int>(this->elementCount);
      i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4);
      local_80 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4);
      while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_1,&local_80),
            bVar1) {
        kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
        __range4 = __range4 + (this->structDataSize >> 6);
        RStack_94 = kj::zeroTo<unsigned_short>(this->structPointerCount);
        ___end5 = &stack0xffffffffffffff6c;
        local_96 = kj::Range<unsigned_short>::begin(___end5);
        local_98 = kj::Range<unsigned_short>::end(___end5);
        while (bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_96,&local_98), bVar1)
        {
          puVar5 = kj::Range<unsigned_short>::Iterator::operator*(&local_96);
          local_9a = *puVar5;
          MVar6 = WireHelpers::totalSize(this->segment,(WirePointer *)__range4,this->nestingLimit);
          local_b0.wordCount = MVar6.wordCount;
          local_b0.capCount = MVar6.capCount;
          MessageSizeCounts::operator+=((MessageSizeCounts *)&this_local,&local_b0);
          __range4 = __range4 + 1;
          kj::Range<unsigned_short>::Iterator::operator++(&local_96);
        }
        kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
      }
    }
  }
  if (this->segment != (SegmentReader *)0x0) {
    SegmentReader::unread(this->segment,(WordCount64)this_local);
  }
  MVar6.capCount = (undefined4)result.wordCount;
  MVar6.wordCount = (WordCountN<61,_uint64_t>)this_local;
  MVar6._12_4_ = 0;
  return MVar6;
}

Assistant:

MessageSizeCounts ListReader::totalSize() const {
  // TODO(cleanup): This is kind of a lot of logic duplicated from WireHelpers::totalSize(), but
  //   it's unclear how to share it effectively.

  MessageSizeCounts result = { ZERO * WORDS, 0 };

  switch (elementSize) {
    case ElementSize::VOID:
      // Nothing.
      break;
    case ElementSize::BIT:
    case ElementSize::BYTE:
    case ElementSize::TWO_BYTES:
    case ElementSize::FOUR_BYTES:
    case ElementSize::EIGHT_BYTES:
      result.addWords(WireHelpers::roundBitsUpToWords(
          upgradeBound<uint64_t>(elementCount) * dataBitsPerElement(elementSize)));
      break;
    case ElementSize::POINTER: {
      auto count = elementCount * (POINTERS / ELEMENTS);
      result.addWords(count * WORDS_PER_POINTER);

      for (auto i: kj::zeroTo(count)) {
        result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                         nestingLimit);
      }
      break;
    }
    case ElementSize::INLINE_COMPOSITE: {
      // Don't forget to count the tag word.
      auto wordSize = upgradeBound<uint64_t>(elementCount) * step / BITS_PER_WORD;
      result.addWords(wordSize + POINTER_SIZE_IN_WORDS);

      if (structPointerCount > ZERO * POINTERS) {
        const word* pos = reinterpret_cast<const word*>(ptr);
        for (auto i KJ_UNUSED: kj::zeroTo(elementCount)) {
          pos += structDataSize / BITS_PER_WORD;

          for (auto j KJ_UNUSED: kj::zeroTo(structPointerCount)) {
            result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                             nestingLimit);
            pos += POINTER_SIZE_IN_WORDS;
          }
        }
      }
      break;
    }
  }

  if (segment != nullptr) {
    // This traversal should not count against the read limit, because it's highly likely that
    // the caller is going to traverse the object again, e.g. to copy it.
    segment->unread(result.wordCount);
  }

  return result;
}